

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_update.cpp
# Opt level: O2

TableUpdateState * __thiscall
duckdb::UpdateLocalState::GetUpdateState
          (UpdateLocalState *this,DataTable *table,TableCatalogEntry *tableref,
          ClientContext *context)

{
  __uniq_ptr_impl<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_> __p;
  tuple<duckdb::TableUpdateState_*,_std::default_delete<duckdb::TableUpdateState>_> in_RAX;
  type pTVar1;
  _Head_base<0UL,_duckdb::TableUpdateState_*,_false> local_18;
  
  local_18._M_head_impl =
       (TableUpdateState *)
       in_RAX.
       super__Tuple_impl<0UL,_duckdb::TableUpdateState_*,_std::default_delete<duckdb::TableUpdateState>_>
       .super__Head_base<0UL,_duckdb::TableUpdateState_*,_false>._M_head_impl;
  if ((this->update_state).
      super_unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::TableUpdateState_*,_std::default_delete<duckdb::TableUpdateState>_>
      .super__Head_base<0UL,_duckdb::TableUpdateState_*,_false>._M_head_impl ==
      (TableUpdateState *)0x0) {
    DataTable::InitializeUpdate
              ((DataTable *)&stack0xffffffffffffffe8,(TableCatalogEntry *)table,
               (ClientContext *)tableref,
               (vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
                *)context);
    __p._M_t.
    super__Tuple_impl<0UL,_duckdb::TableUpdateState_*,_std::default_delete<duckdb::TableUpdateState>_>
    .super__Head_base<0UL,_duckdb::TableUpdateState_*,_false>._M_head_impl =
         (tuple<duckdb::TableUpdateState_*,_std::default_delete<duckdb::TableUpdateState>_>)
         (tuple<duckdb::TableUpdateState_*,_std::default_delete<duckdb::TableUpdateState>_>)
         local_18._M_head_impl;
    local_18._M_head_impl = (TableUpdateState *)0x0;
    ::std::__uniq_ptr_impl<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>
    ::reset((__uniq_ptr_impl<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>
             *)&this->update_state,
            (pointer)__p._M_t.
                     super__Tuple_impl<0UL,_duckdb::TableUpdateState_*,_std::default_delete<duckdb::TableUpdateState>_>
                     .super__Head_base<0UL,_duckdb::TableUpdateState_*,_false>._M_head_impl);
    ::std::unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>::
    ~unique_ptr((unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>
                 *)&stack0xffffffffffffffe8);
  }
  pTVar1 = unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>,_true>
           ::operator*(&this->update_state);
  return pTVar1;
}

Assistant:

TableUpdateState &GetUpdateState(DataTable &table, TableCatalogEntry &tableref, ClientContext &context) {
		if (!update_state) {
			update_state = table.InitializeUpdate(tableref, context, bound_constraints);
		}
		return *update_state;
	}